

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
* __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
          (RepeatedPtrFieldBase *this,int index)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  void **ppvVar5;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar6;
  LogMessage local_58;
  Voidify local_41;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *pRStack_10;
  int index_local;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result._4_4_ = index;
  pRStack_10 = this;
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(index);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"index >= 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0xcc,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->current_size_);
  local_40 = absl::lts_20250127::log_internal::Check_LTImpl(iVar1,iVar2,"index < current_size_");
  if (local_40 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0xcd,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  ppvVar5 = element_at(this,absl_log_internal_check_op_result._4_4_);
  pVVar6 = cast<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (*ppvVar5);
  return pVVar6;
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    if constexpr (GetBoundsCheckMode() == BoundsCheckMode::kAbort) {
      RuntimeAssertInBounds(index, current_size_);
    } else {
      ABSL_DCHECK_GE(index, 0);
      ABSL_DCHECK_LT(index, current_size_);
    }
    return cast<TypeHandler>(element_at(index));
  }